

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# valcvt.h
# Opt level: O0

void __thiscall
mp::pre::ValuePresolverImpl::
WriteNodes<mp::MiniJSONWriter<fmt::BasicMemoryWriter<char,std::allocator<char>>>>
          (ValuePresolverImpl *this,
          MiniJSONWriter<fmt::BasicMemoryWriter<char,_std::allocator<char>_>_> *jw,
          vector<mp::pre::NodeRange,_std::allocator<mp::pre::NodeRange>_> *nodes)

{
  string_view key;
  string_view key_00;
  bool bVar1;
  size_type sVar2;
  const_reference this_00;
  string *this_01;
  ValueNode *pVVar3;
  NodeIndexRange NVar4;
  vector<mp::pre::NodeRange,_std::allocator<mp::pre::NodeRange>_> *in_RDX;
  int *in_RSI;
  Node jelement;
  value_type *nd;
  size_t i;
  int *in_stack_ffffffffffffff28;
  Node *in_stack_ffffffffffffff30;
  string *in_stack_ffffffffffffff38;
  undefined4 in_stack_ffffffffffffff60;
  int in_stack_ffffffffffffff64;
  int in_stack_ffffffffffffff68;
  int in_stack_ffffffffffffff6c;
  NodeIndexRange in_stack_ffffffffffffff70;
  char *in_stack_ffffffffffffff78;
  undefined8 local_20;
  
  local_20 = 0;
  while( true ) {
    sVar2 = std::vector<mp::pre::NodeRange,_std::allocator<mp::pre::NodeRange>_>::size(in_RDX);
    if (sVar2 <= local_20) break;
    this_00 = std::vector<mp::pre::NodeRange,_std::allocator<mp::pre::NodeRange>_>::operator[]
                        (in_RDX,local_20);
    MiniJSONWriter<fmt::BasicMemoryWriter<char,_std::allocator<char>_>_>::operator++
              ((MiniJSONWriter<fmt::BasicMemoryWriter<char,_std::allocator<char>_>_> *)
               in_stack_ffffffffffffff38);
    bVar1 = NodeRange::IsSingleIndex((NodeRange *)0x1a4e07);
    if (bVar1) {
      NodeRange::operator_cast_to_int((NodeRange *)0x1a4e27);
      pVVar3 = NodeRange::GetValueNode(this_00);
      this_01 = ValueNode::GetName_abi_cxx11_(pVVar3);
      std::__cxx11::string::operator_cast_to_basic_string_view((string *)this_01);
      key._M_str = in_stack_ffffffffffffff78;
      key._M_len._0_4_ = in_stack_ffffffffffffff70.beg_;
      key._M_len._4_4_ = in_stack_ffffffffffffff70.end_;
      MiniJSONWriter<fmt::BasicMemoryWriter<char,_std::allocator<char>_>_>::operator[]
                ((MiniJSONWriter<fmt::BasicMemoryWriter<char,_std::allocator<char>_>_> *)
                 CONCAT44(in_stack_ffffffffffffff6c,in_stack_ffffffffffffff68),key);
      MiniJSONWriter<fmt::BasicMemoryWriter<char,std::allocator<char>>>::operator=
                (in_stack_ffffffffffffff30,in_stack_ffffffffffffff28);
      MiniJSONWriter<fmt::BasicMemoryWriter<char,_std::allocator<char>_>_>::~MiniJSONWriter
                ((MiniJSONWriter<fmt::BasicMemoryWriter<char,_std::allocator<char>_>_> *)0x1a4ead);
    }
    else {
      pVVar3 = NodeRange::GetValueNode(this_00);
      in_stack_ffffffffffffff38 = ValueNode::GetName_abi_cxx11_(pVVar3);
      in_stack_ffffffffffffff78 =
           (char *)std::__cxx11::string::operator_cast_to_basic_string_view
                             ((string *)in_stack_ffffffffffffff38);
      key_00._M_str = in_stack_ffffffffffffff78;
      key_00._M_len._0_4_ = in_stack_ffffffffffffff70.beg_;
      key_00._M_len._4_4_ = in_stack_ffffffffffffff70.end_;
      MiniJSONWriter<fmt::BasicMemoryWriter<char,_std::allocator<char>_>_>::operator[]
                ((MiniJSONWriter<fmt::BasicMemoryWriter<char,_std::allocator<char>_>_> *)
                 CONCAT44(in_stack_ffffffffffffff6c,in_stack_ffffffffffffff68),key_00);
      in_stack_ffffffffffffff70 = NodeRange::GetIndexRange(this_00);
      in_stack_ffffffffffffff30 =
           MiniJSONWriter<fmt::BasicMemoryWriter<char,std::allocator<char>>>::operator<<
                     ((MiniJSONWriter<fmt::BasicMemoryWriter<char,_std::allocator<char>_>_> *)
                      CONCAT44(in_stack_ffffffffffffff64,in_stack_ffffffffffffff60),in_RSI);
      NVar4 = NodeRange::GetIndexRange(this_00);
      in_stack_ffffffffffffff64 = NVar4.beg_;
      in_stack_ffffffffffffff68 = NVar4.end_;
      in_stack_ffffffffffffff6c = in_stack_ffffffffffffff68 + -1;
      MiniJSONWriter<fmt::BasicMemoryWriter<char,std::allocator<char>>>::operator<<
                ((MiniJSONWriter<fmt::BasicMemoryWriter<char,_std::allocator<char>_>_> *)
                 CONCAT44(in_stack_ffffffffffffff64,in_stack_ffffffffffffff60),in_RSI);
      MiniJSONWriter<fmt::BasicMemoryWriter<char,_std::allocator<char>_>_>::~MiniJSONWriter
                ((MiniJSONWriter<fmt::BasicMemoryWriter<char,_std::allocator<char>_>_> *)0x1a4f9e);
    }
    MiniJSONWriter<fmt::BasicMemoryWriter<char,_std::allocator<char>_>_>::~MiniJSONWriter
              ((MiniJSONWriter<fmt::BasicMemoryWriter<char,_std::allocator<char>_>_> *)0x1a4fcd);
    local_20 = local_20 + 1;
  }
  return;
}

Assistant:

void WriteNodes(JSON jw, const std::vector<NodeRange>& nodes) {
    for (size_t i=0; i<nodes.size(); ++i) {
      const auto& nd = nodes[i];
      auto jelement = ++jw;       // jw is an array of dict's
      if (nd.IsSingleIndex())
        jelement[nd.GetValueNode()->GetName()] = (int)nd;
      else
        jelement[nd.GetValueNode()->GetName()]
            << nd.GetIndexRange().beg_
            << (nd.GetIndexRange().end_-1);  // print the exact last value
    }
  }